

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

void __thiscall
QPDFArgParser::addInvalidChoiceHandler(QPDFArgParser *this,string *arg,param_arg_handler_t *handler)

{
  bool bVar1;
  element_type *peVar2;
  logic_error *this_00;
  pointer ppVar3;
  OptionEntry *oe;
  _Self local_30;
  _Self local_28;
  iterator i;
  param_arg_handler_t *handler_local;
  string *arg_local;
  QPDFArgParser *this_local;
  
  i._M_node = (_Base_ptr)handler;
  peVar2 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
       ::find(peVar2->option_table,arg);
  peVar2 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
       ::end(peVar2->option_table);
  bVar1 = std::operator==(&local_28,&local_30);
  if (!bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>
             ::operator->(&local_28);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator=(&(ppVar3->second).invalid_choice_handler,handler);
    return;
  }
  QTC::TC("libtests","QPDFArgParser invalid choice handler to unknown",0);
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_00,"QPDFArgParser: attempt to add invalid choice handler to unknown argument");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
QPDFArgParser::addInvalidChoiceHandler(std::string const& arg, param_arg_handler_t handler)
{
    auto i = m->option_table->find(arg);
    if (i == m->option_table->end()) {
        QTC::TC("libtests", "QPDFArgParser invalid choice handler to unknown");
        throw std::logic_error(
            "QPDFArgParser: attempt to add invalid choice handler to unknown argument");
    }
    auto& oe = i->second;
    oe.invalid_choice_handler = handler;
}